

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void __thiscall
duckdb::HistogramBinState<unsigned_int>::Destroy(HistogramBinState<unsigned_int> *this)

{
  void *pvVar1;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    pvVar1 = (void *)*in_RDI;
    if (pvVar1 != (void *)0x0) {
      vector<unsigned_int,_false>::~vector((vector<unsigned_int,_false> *)0xb79546);
      operator_delete(pvVar1);
    }
    *in_RDI = 0;
  }
  if (in_RDI[1] != 0) {
    pvVar1 = (void *)in_RDI[1];
    if (pvVar1 != (void *)0x0) {
      vector<unsigned_long,_false>::~vector((vector<unsigned_long,_false> *)0xb79586);
      operator_delete(pvVar1);
    }
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

void Destroy() {
		if (bin_boundaries) {
			delete bin_boundaries;
			bin_boundaries = nullptr;
		}
		if (counts) {
			delete counts;
			counts = nullptr;
		}
	}